

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Stress::anon_unknown_0::TextureSamplerCase::init
          (TextureSamplerCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  GLuint *pGVar2;
  TestType TVar3;
  int iVar4;
  deUint32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  void *__s;
  NotSupportedError *pNVar7;
  int y;
  long lVar8;
  int level;
  long lVar9;
  EVP_PKEY_CTX *ctx_00;
  uint uVar10;
  long lVar11;
  GLint maxVertexTexUnits;
  char local_1e8 [20];
  GLint maxTextureSize;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  undefined4 extraout_var_01;
  
  ctx_00 = (EVP_PKEY_CTX *)&maxTextureSize;
  maxTextureSize = 0;
  iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(0xd33);
  if (maxTextureSize < 0x80) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    _maxVertexTexUnits = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&maxVertexTexUnits,"GL_MAX_TEXTURE_SIZE must be at least ","");
    de::toString<int>(&local_1d0,&(anonymous_namespace)::TEST_TEXTURE_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxVertexTexUnits,&local_1d0);
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    ctx_00 = (EVP_PKEY_CTX *)&maxVertexTexUnits;
    _maxVertexTexUnits = _maxVertexTexUnits & 0xffffffff00000000;
    iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
              [3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x868))(0x8b4c);
    if (maxVertexTexUnits < 1) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1","");
      tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_1b0);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  RenderCase::init(&this->super_RenderCase,ctx_00);
  iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar6 = CONCAT44(extraout_var_01,iVar4);
  __s = operator_new(0x10000);
  memset(__s,0,0x10000);
  deRandom_init((deRandom *)&maxVertexTexUnits,0x3039);
  pGVar2 = &this->m_textureID;
  (**(code **)(lVar6 + 0x6f8))(1);
  lVar9 = (long)__s + 3;
  lVar11 = 0;
  do {
    lVar8 = 0;
    do {
      dVar5 = deRandom_getUint32((deRandom *)&maxVertexTexUnits);
      *(char *)(lVar9 + -3 + lVar8 * 4) = (char)dVar5;
      *(undefined1 *)(lVar9 + -2 + lVar8 * 4) = 0xff;
      dVar5 = deRandom_getUint32((deRandom *)&maxVertexTexUnits);
      *(char *)(lVar9 + -1 + lVar8 * 4) = (char)dVar5;
      *(undefined1 *)(lVar9 + lVar8 * 4) = 0xff;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x80);
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x200;
  } while (lVar11 != 0x80);
  TVar3 = this->m_testType;
  if (TVar3 == TEST_TEX_COORD) {
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating a 2D texture with a test pattern.",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar6 + 0xb8))(0xde1,*pGVar2);
    (**(code **)(lVar6 + 0x1310))(0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,__s);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2601);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    iVar4 = 0x42b;
  }
  else if (TVar3 == TEST_LOD) {
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating a mipmapped 2D texture with a test pattern.",0x34);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar6 + 0xb8))(0xde1,*pGVar2);
    iVar4 = 0;
    do {
      uVar10 = 0x80 >> ((byte)iVar4 & 0x1f);
      (**(code **)(lVar6 + 0x1310))(0xde1,iVar4,0x1908,uVar10,uVar10,0,0x1908,0x1401,__s);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 8);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2703);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    iVar4 = 0x438;
  }
  else {
    if (TVar3 != TEST_TEX_COORD_CUBE) goto LAB_00454957;
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating a cube map with a test pattern.",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar6 + 0xb8))(0x8513,*pGVar2);
    lVar9 = 0;
    do {
      (**(code **)(lVar6 + 0x1310))
                (*(undefined4 *)((long)init::faces + lVar9),0,0x1908,0x20,0x20,0,0x1908,0x1401,__s);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x18);
    (**(code **)(lVar6 + 0x1360))(0x8513,0x2800,0x2601);
    (**(code **)(lVar6 + 0x1360))(0x8513,0x2801,0x2601);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    iVar4 = 0x451;
  }
  glu::checkError(dVar5,"TextureSamplerCase::init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,iVar4);
LAB_00454957:
  operator_delete(__s,0x10000);
  return extraout_EAX;
}

Assistant:

void TextureSamplerCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	// vertex shader supports textures?
	if (m_type == TYPE_VERTEX)
	{
		GLint maxVertexTexUnits = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTexUnits);
		if (maxVertexTexUnits < 1)
			throw tcu::NotSupportedError("GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1");
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		std::vector<deUint8>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*4);
		de::Random				rnd		(12345);

		gl.genTextures(1, &m_textureID);

		for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
		for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
		{
			// RGBA8, green and alpha channel are always 255 for verification
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 0] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 1] = 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 2] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 3] = 0xFF;
		}

		if (m_testType == TEST_TEX_COORD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_LOD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a mipmapped 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);

			for (int level = 0; (TEST_TEXTURE_SIZE >> level); ++level)
				gl.texImage2D(GL_TEXTURE_2D, level, GL_RGBA, TEST_TEXTURE_SIZE >> level, TEST_TEXTURE_SIZE >> level, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_TEX_COORD_CUBE)
		{
			DE_STATIC_ASSERT(TEST_TEXTURE_CUBE_SIZE <= TEST_TEXTURE_SIZE);

			static const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
			};

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a cube map with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

			for (int faceNdx = 0; faceNdx < DE_LENGTH_OF_ARRAY(faces); ++faceNdx)
				gl.texImage2D(faces[faceNdx], 0, GL_RGBA, TEST_TEXTURE_CUBE_SIZE, TEST_TEXTURE_CUBE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
}